

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O1

void __thiscall duckdb::TableStatistics::Serialize(TableStatistics *this,Serializer *serializer)

{
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var1;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> _Var2;
  pointer pBVar3;
  ReservoirSample *pRVar4;
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true> to_serialize
  ;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_30;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_28;
  _Head_base<0UL,_duckdb::BlockingSample_*,_false> local_20;
  
  (*serializer->_vptr_Serializer[2])(serializer,100,"column_stats");
  Serializer::WriteValue<duckdb::shared_ptr<duckdb::ColumnStatistics,true>>
            (serializer,&this->column_stats);
  (*serializer->_vptr_Serializer[3])(serializer);
  local_30._M_head_impl = (BlockingSample *)0x0;
  if ((this->table_sample).
      super_unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>._M_t.
      super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
      .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl != (BlockingSample *)0x0)
  {
    pBVar3 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->(&this->table_sample);
    pRVar4 = BlockingSample::Cast<duckdb::ReservoirSample>(pBVar3);
    (*(pRVar4->super_BlockingSample)._vptr_BlockingSample[3])(&local_28,pRVar4);
    _Var2._M_head_impl = local_28._M_head_impl;
    _Var1._M_head_impl = local_30._M_head_impl;
    local_28._M_head_impl = (BlockingSample *)0x0;
    local_30._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (BlockingSample *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_BlockingSample[1])();
    }
    if (local_28._M_head_impl != (BlockingSample *)0x0) {
      (*(local_28._M_head_impl)->_vptr_BlockingSample[1])();
    }
    local_28._M_head_impl = (BlockingSample *)0x0;
    pBVar3 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
             operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                         *)&local_30);
    pRVar4 = BlockingSample::Cast<duckdb::ReservoirSample>(pBVar3);
    ReservoirSample::EvictOverBudgetSamples(pRVar4);
  }
  local_20._M_head_impl = (BlockingSample *)0x0;
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::BlockingSample,std::default_delete<duckdb::BlockingSample>,true>>
            (serializer,0x65,"table_sample",
             (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
              *)&local_30,
             (unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
              *)&local_20);
  if (local_20._M_head_impl != (BlockingSample *)0x0) {
    (*(local_20._M_head_impl)->_vptr_BlockingSample[1])();
  }
  if (local_30._M_head_impl != (BlockingSample *)0x0) {
    (*(local_30._M_head_impl)->_vptr_BlockingSample[1])();
  }
  return;
}

Assistant:

void TableStatistics::Serialize(Serializer &serializer) const {
	serializer.WriteProperty(100, "column_stats", column_stats);
	unique_ptr<BlockingSample> to_serialize = nullptr;
	if (table_sample) {
		D_ASSERT(table_sample->type == SampleType::RESERVOIR_SAMPLE);
		auto &reservoir_sample = table_sample->Cast<ReservoirSample>();
		to_serialize = unique_ptr_cast<BlockingSample, ReservoirSample>(reservoir_sample.Copy());
		auto &res_serialize = to_serialize->Cast<ReservoirSample>();
		res_serialize.EvictOverBudgetSamples();
	}
	serializer.WritePropertyWithDefault<unique_ptr<BlockingSample>>(101, "table_sample", to_serialize, nullptr);
}